

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O2

Country * __thiscall Map::addNode(Map *this,int id,string *name,int continent)

{
  Country *this_00;
  Country *thisCountry;
  string local_50;
  
  this_00 = (Country *)operator_new(0x30);
  std::__cxx11::string::string((string *)&local_50,(string *)name);
  Country::Country(this_00,id,&local_50,continent);
  std::__cxx11::string::~string((string *)&local_50);
  thisCountry = this_00;
  std::vector<Map::Country_*,_std::allocator<Map::Country_*>_>::push_back
            (this->pMapCountries,&thisCountry);
  Continent::addCountry
            ((this->pMapContinents->
             super__Vector_base<Map::Continent_*,_std::allocator<Map::Continent_*>_>)._M_impl.
             super__Vector_impl_data._M_start[(long)continent + -1],thisCountry);
  return thisCountry;
}

Assistant:

Map::Country* Map::addNode(int id, std::string name, int continent) {
    //create graph node
    auto* thisCountry = new Country(id, std::move(name), continent);
    //add node to graph (overall graph)
    pMapCountries->push_back(thisCountry);
    //add node to relevant subgraph
    (*pMapContinents)[continent - 1]->addCountry(thisCountry);
    return thisCountry;
}